

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_readPDOassign(ecx_contextt *context,uint16 Slave,uint16 PDOassign)

{
  ushort index;
  uint8 uVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  ushort local_54;
  uint8 subcnt;
  int rdl;
  uint16 local_4c;
  ushort local_4a;
  uint local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  ecx_contextt *local_38;
  
  rdl = 2;
  local_54 = 0;
  iVar3 = 0;
  iVar2 = ecx_SDOread(context,Slave,PDOassign,'\0','\0',&rdl,&local_54,700000);
  local_4a = local_54;
  if (local_54 != 0 && 0 < iVar2) {
    uVar6 = CONCAT62((int6)((ulong)&local_54 >> 0x10),1);
    iVar3 = 0;
    uVar5 = (uint)Slave;
    local_40 = (uint)PDOassign;
    local_48 = (uint)Slave;
    local_38 = context;
    do {
      rdl = 2;
      local_54 = 0;
      ecx_SDOread(context,(uint16)uVar5,(uint16)local_40,(uint8)uVar6,'\0',&rdl,&local_54,700000);
      index = local_54;
      iVar2 = (int)uVar6;
      if (local_54 != 0) {
        rdl = 1;
        subcnt = '\0';
        local_3c = (int)uVar6;
        ecx_SDOread(context,(uint16)uVar5,local_54,'\0','\0',&rdl,&subcnt,700000);
        uVar1 = subcnt;
        local_4c = local_54;
        context = local_38;
        uVar5 = local_48;
        iVar2 = local_3c;
        if (subcnt != '\0') {
          uVar4 = 0;
          do {
            rdl = 4;
            local_44 = 0;
            ecx_SDOread(local_38,(uint16)local_48,index,(char)uVar4 + '\x01','\0',&rdl,&local_44,
                        700000);
            uVar5 = local_44 & 0xff;
            if ((char)local_44 == -1) {
              uVar5 = 0xff;
              local_4c = 0xff;
            }
            iVar3 = iVar3 + uVar5;
            uVar4 = uVar4 + 1;
            context = local_38;
            uVar5 = local_48;
            iVar2 = local_3c;
          } while (uVar1 != uVar4);
        }
      }
      uVar6 = (ulong)(iVar2 + 1U);
    } while ((ushort)(iVar2 + 1U) <= local_4a);
  }
  return iVar3;
}

Assistant:

int ecx_readPDOassign(ecx_contextt *context, uint16 Slave, uint16 PDOassign)
{
   uint16 idxloop, nidx, subidxloop, rdat, idx, subidx;
   uint8 subcnt;
   int wkc, bsize = 0, rdl;
   int32 rdat2;

   rdl = sizeof(rdat); rdat = 0;
   /* read PDO assign subindex 0 ( = number of PDO's) */
   wkc = ecx_SDOread(context, Slave, PDOassign, 0x00, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
   rdat = etohs(rdat);
   /* positive result from slave ? */
   if ((wkc > 0) && (rdat > 0))
   {
      /* number of available sub indexes */
      nidx = rdat;
      bsize = 0;
      /* read all PDO's */
      for (idxloop = 1; idxloop <= nidx; idxloop++)
      {
         rdl = sizeof(rdat); rdat = 0;
         /* read PDO assign */
         wkc = ecx_SDOread(context, Slave, PDOassign, (uint8)idxloop, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
         /* result is index of PDO */
         idx = etohl(rdat);
         if (idx > 0)
         {
            rdl = sizeof(subcnt); subcnt = 0;
            /* read number of subindexes of PDO */
            wkc = ecx_SDOread(context, Slave,idx, 0x00, FALSE, &rdl, &subcnt, EC_TIMEOUTRXM);
            subidx = subcnt;
            /* for each subindex */
            for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
            {
               rdl = sizeof(rdat2); rdat2 = 0;
               /* read SDO that is mapped in PDO */
               wkc = ecx_SDOread(context, Slave, idx, (uint8)subidxloop, FALSE, &rdl, &rdat2, EC_TIMEOUTRXM);
               rdat2 = etohl(rdat2);
               /* extract bitlength of SDO */
               if (LO_BYTE(rdat2) < 0xff)
               {
                  bsize += LO_BYTE(rdat2);
               }
               else
               {
                  rdl = sizeof(rdat); rdat = htoes(0xff);
                  /* read Object Entry in Object database */
//                  wkc = ec_readOEsingle(idx, (uint8)SubCount, pODlist, pOElist);
                  bsize += etohs(rdat);                  
               }
            }
         }
      }
   }
   /* return total found bitlength (PDO) */
   return bsize;
}